

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_send_recv.c
# Opt level: O0

int kvT_send_recv(int rank,int ranks)

{
  long local_38;
  kvtree *recv;
  kvtree *send;
  int local_20;
  int val_of_three;
  int val_of_two;
  int val_of_one;
  int kvtree_rc;
  int ranks_local;
  int rank_local;
  
  val_of_one = ranks;
  kvtree_rc = rank;
  recv = (kvtree *)kvtree_new();
  local_38 = kvtree_new();
  if (kvtree_rc == 0) {
    kvtree_util_set_int(recv,"ONE",1);
  }
  else if (kvtree_rc == 1) {
    kvtree_util_set_int(recv,"TWO",2);
  }
  else {
    kvtree_util_set_int(recv,"THREE",3);
  }
  val_of_two = kvtree_sendrecv(recv,(long)(kvtree_rc + 1) % (long)val_of_one & 0xffffffff,local_38,
                               (long)(kvtree_rc + -1 + val_of_one) % (long)val_of_one & 0xffffffff,
                               &ompi_mpi_comm_world);
  if (val_of_two != 0) {
    printf("test_kvtree_send_recv, kvtree_sendrecv call failed");
    printf("Error in line %d, file %s, function %s.\n",0xa0,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
           ,"kvT_send_recv");
    return 1;
  }
  if (kvtree_rc == 0) {
    val_of_two = kvtree_util_get_int(recv,"ONE",&val_of_three);
    if (val_of_two != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read send value of \'ONE\'");
      printf("Error in line %d, file %s, function %s.\n",0xa7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    if (val_of_three != 1) {
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf("Error in line %d, file %s, function %s.\n",0xac,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    val_of_two = kvtree_util_get_int(local_38,"THREE",(long)&send + 4);
    if (val_of_two != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of \'THREE\'");
      printf("Error in line %d, file %s, function %s.\n",0xb2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    if (send._4_4_ != 3) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf("Error in line %d, file %s, function %s.\n",0xb7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
  }
  val_of_two = 0;
  if (kvtree_rc == 1) {
    val_of_two = kvtree_util_get_int(recv,"TWO",&local_20);
    if (val_of_two != 0) {
      printf("test_kvtree_send_recv, in rank 1 could not read send value of \'TWO\'");
      printf("Error in line %d, file %s, function %s.\n",0xbf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    if (local_20 != 2) {
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf("Error in line %d, file %s, function %s.\n",0xc4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    val_of_two = kvtree_util_get_int(local_38,"ONE",&val_of_three);
    if (val_of_two != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of \'ONE\'");
      printf("Error in line %d, file %s, function %s.\n",0xca,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    if (val_of_three != 1) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf("Error in line %d, file %s, function %s.\n",0xcf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
  }
  val_of_two = 0;
  if (kvtree_rc == 2) {
    val_of_two = kvtree_util_get_int(recv,"THREE",(long)&send + 4);
    if (val_of_two != 0) {
      printf("test_kvtree_send_recv, in rank 2 could not read send value of \'THREE\'");
      printf("Error in line %d, file %s, function %s.\n",0xd7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    if (send._4_4_ != 3) {
      printf("test_kvtree_send_recv, in rank 2 send value is not correct");
      printf("Error in line %d, file %s, function %s.\n",0xdc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    val_of_two = kvtree_util_get_int(local_38,"TWO",&local_20);
    if (val_of_two != 0) {
      printf("test_kvtree_send_recv, in rank 2 could not read recv value of \'TWO\'");
      printf("Error in line %d, file %s, function %s.\n",0xe2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
    if (local_20 != 2) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf("Error in line %d, file %s, function %s.\n",0xe7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      return 1;
    }
  }
  val_of_two = 0;
  printf("rank = %d\n",(ulong)(uint)kvtree_rc);
  printf("SEND HASH\n");
  kvtree_print(recv,4);
  printf("RECEIVE HASH\n");
  kvtree_print(local_38,4);
  kvtree_delete(&recv);
  if (recv == (kvtree *)0x0) {
    kvtree_delete(&local_38);
    if (local_38 == 0) {
      ranks_local = 0;
    }
    else {
      printf("test_kvtree_send_recv, deletion of recv failed");
      printf("Error in line %d, file %s, function %s.\n",0xfc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
             ,"kvT_send_recv");
      ranks_local = 1;
    }
  }
  else {
    printf("test_kvtree_send_recv, deletion of kvtree failed");
    printf("Error in line %d, file %s, function %s.\n",0xf6,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
           ,"kvT_send_recv");
    ranks_local = 1;
  }
  return ranks_local;
}

Assistant:

int kvT_send_recv(int rank, int ranks){
  int kvtree_rc;
  int val_of_one, val_of_two, val_of_three;
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();
  if(rank == 0)
    kvtree_util_set_int(send, "ONE", 1);
  else if(rank == 1) 
    kvtree_util_set_int(send, "TWO", 2);
  else
    kvtree_util_set_int(send, "THREE", 3);
// with ranks in a circular queue, send to 1 rank forward, receive from 1 rank back
  kvtree_rc = kvtree_sendrecv(send, (rank+1) % ranks, recv, (rank-1+ranks) % ranks, MPI_COMM_WORLD);
  if(kvtree_rc != TEST_PASS){
    printf("test_kvtree_send_recv, kvtree_sendrecv call failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  if(rank == 0){
    kvtree_rc = kvtree_util_get_int(send, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read send value of 'ONE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if (val_of_one != 1){
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of 'THREE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if (val_of_three != 3){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }
  if(rank == 1){
    kvtree_rc = kvtree_util_get_int(send, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 1 could not read send value of 'TWO'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_two != 2){
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of 'ONE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_one != 1){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }
  if(rank == 2){
    kvtree_rc = kvtree_util_get_int(send, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 2 could not read send value of 'THREE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_three != 3){
      printf("test_kvtree_send_recv, in rank 2 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 2 could not read recv value of 'TWO'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_two != 2){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }

  printf("rank = %d\n", rank);
  printf("SEND HASH\n");
  kvtree_print(send, 4);
  printf("RECEIVE HASH\n");
  kvtree_print(recv, 4);
 
  
  kvtree_delete(&send);
  if (send != NULL){
    printf("test_kvtree_send_recv, deletion of kvtree failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
     return TEST_FAIL;
  }
  kvtree_delete(&recv);
  if (recv != NULL){
    printf("test_kvtree_send_recv, deletion of recv failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
     return TEST_FAIL;
  }

  return TEST_PASS;
}